

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint16_t icu_63::getExtName(uint32_t code,char *buffer,uint16_t bufferLength)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  bool bVar4;
  int local_38;
  int iStack_34;
  uint8_t v;
  int i;
  int ndigits;
  UChar32 cp;
  uint16_t length;
  char *catname;
  char *pcStack_18;
  uint16_t bufferLength_local;
  char *buffer_local;
  uint32_t code_local;
  
  pcVar3 = getCharCatName(code);
  catname._6_2_ = bufferLength;
  pcStack_18 = buffer;
  if (bufferLength != 0) {
    pcStack_18 = buffer + 1;
    *buffer = '<';
    catname._6_2_ = bufferLength - 1;
  }
  ndigits._2_2_ = 1;
  while (pcVar3[(int)(ndigits._2_2_ - 1)] != '\0') {
    if (catname._6_2_ != 0) {
      *pcStack_18 = pcVar3[(int)(ndigits._2_2_ - 1)];
      catname._6_2_ = catname._6_2_ - 1;
      pcStack_18 = pcStack_18 + 1;
    }
    ndigits._2_2_ = ndigits._2_2_ + 1;
  }
  if (catname._6_2_ != 0) {
    *pcStack_18 = '-';
    catname._6_2_ = catname._6_2_ - 1;
    pcStack_18 = pcStack_18 + 1;
  }
  iStack_34 = 0;
  for (i = code; i != 0; i = i >> 4) {
    iStack_34 = iStack_34 + 1;
  }
  if (iStack_34 < 4) {
    iStack_34 = 4;
  }
  local_38 = iStack_34;
  i = code;
  while( true ) {
    if ((i != 0) || (bVar4 = false, 0 < local_38)) {
      bVar4 = catname._6_2_ != 0;
    }
    if (!bVar4) break;
    bVar1 = (byte)i & 0xf;
    if (bVar1 < 10) {
      cVar2 = bVar1 + 0x30;
    }
    else {
      cVar2 = bVar1 + 0x37;
    }
    local_38 = local_38 + -1;
    pcStack_18[local_38] = cVar2;
    i = i >> 4;
    catname._6_2_ = catname._6_2_ - 1;
  }
  if (catname._6_2_ != 0) {
    pcStack_18[iStack_34] = '>';
  }
  return ndigits._2_2_ + (short)iStack_34 + 2;
}

Assistant:

static uint16_t getExtName(uint32_t code, char *buffer, uint16_t bufferLength) {
    const char *catname = getCharCatName(code);
    uint16_t length = 0;

    UChar32 cp;
    int ndigits, i;
    
    WRITE_CHAR(buffer, bufferLength, length, '<');
    while (catname[length - 1]) {
        WRITE_CHAR(buffer, bufferLength, length, catname[length - 1]);
    }
    WRITE_CHAR(buffer, bufferLength, length, '-');
    for (cp = code, ndigits = 0; cp; ++ndigits, cp >>= 4)
        ;
    if (ndigits < 4)
        ndigits = 4;
    for (cp = code, i = ndigits; (cp || i > 0) && bufferLength; cp >>= 4, bufferLength--) {
        uint8_t v = (uint8_t)(cp & 0xf);
        buffer[--i] = (v < 10 ? '0' + v : 'A' + v - 10);
    }
    buffer += ndigits;
    length += static_cast<uint16_t>(ndigits);
    WRITE_CHAR(buffer, bufferLength, length, '>');

    return length;
}